

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_scope.c
# Opt level: O0

int scope_define(scope sp,char *key,value val)

{
  int iVar1;
  long in_RDX;
  long in_RSI;
  set_key in_RDI;
  set_key unaff_retaddr;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (((in_RDI == (set_key)0x0) || (in_RSI == 0)) || (in_RDX == 0)) {
    iVar1 = 1;
  }
  else {
    iVar1 = set_contains((set)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI);
    if (iVar1 == 0) {
      log_write_impl_va("metacall",0xb9,"scope_define",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_scope.c"
                        ,LOG_LEVEL_ERROR,
                        "Scope failed to define a object with key \'%s\', this key as already been defined"
                        ,in_RSI);
      iVar1 = 1;
    }
    else {
      iVar1 = set_insert((set)val,unaff_retaddr,
                         (set_value)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
    }
  }
  return iVar1;
}

Assistant:

int scope_define(scope sp, const char *key, value val)
{
	if (sp != NULL && key != NULL && val != NULL)
	{
		if (set_contains(sp->objects, (set_key)key) == 0)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Scope failed to define a object with key '%s', this key as already been defined", (char *)key);

			return 1;
		}

		return set_insert(sp->objects, (set_key)key, (set_value)val);
	}

	return 1;
}